

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::UpdateGroupDependencies(cmComputeLinkDepends *this)

{
  size_t n;
  bool bVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  reference pvVar2;
  cmListFileBacktrace local_c8;
  cmGraphEdge local_b8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  unsigned_long *local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  pos;
  pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *groupItems
  ;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range3;
  size_t index;
  cmGraphEdge *edge;
  iterator __end2;
  iterator __begin2;
  cmGraphEdgeList *__range2;
  cmGraphEdgeList *edgeList;
  iterator __end1;
  iterator __begin1;
  Graph *__range1;
  cmComputeLinkDepends *this_local;
  
  bVar1 = std::
          map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::empty(&this->GroupItems);
  if (!bVar1) {
    __end1 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::begin
                       (&(this->EntryConstraintGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
    edgeList = (cmGraphEdgeList *)
               std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::end
                         (&(this->EntryConstraintGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
                                       *)&edgeList), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
                 ::operator*(&__end1)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
      edge = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                         *)&edge), bVar1) {
        index = (size_t)__gnu_cxx::
                        __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                        ::operator*(&__end2);
        __range3 = (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)index);
        pvVar2 = std::
                 vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ::operator[](&this->EntryList,(size_type)__range3);
        if (((pvVar2->Kind != Group) &&
            (pvVar2 = std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(size_type)__range3), pvVar2->Kind != Flag)) &&
           (pvVar2 = std::
                     vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ::operator[](&this->EntryList,(size_type)__range3), pvVar2->Kind != Object)) {
          __end3 = std::
                   map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::begin(&this->GroupItems);
          groupItems = (pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)std::
                          map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ::end(&this->GroupItems);
          while (bVar1 = std::operator!=(&__end3,(_Self *)&groupItems), bVar1) {
            pos._M_current =
                 &std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator*(&__end3)->first;
            local_88._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
                           (&((reference)pos._M_current)->second);
            local_90 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (pos._M_current + 1));
            local_80 = std::
                       find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                                 (local_88,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )local_90,(unsigned_long *)&__range3);
            local_98._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (pos._M_current + 1));
            bVar1 = __gnu_cxx::operator!=(&local_80,&local_98);
            if (bVar1) {
              n = *pos._M_current;
              local_c8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              local_c8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cmListFileBacktrace::cmListFileBacktrace(&local_c8);
              cmGraphEdge::cmGraphEdge(&local_b8,n,false,false,&local_c8);
              cmGraphEdge::operator=((cmGraphEdge *)index,&local_b8);
              cmGraphEdge::~cmGraphEdge(&local_b8);
              cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
            }
            std::
            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator++(&__end3);
          }
        }
        __gnu_cxx::
        __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>::
        operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<cmGraphEdgeList_*,_std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::UpdateGroupDependencies()
{
  if (this->GroupItems.empty()) {
    return;
  }

  // Walks through all entries of the constraint graph to replace dependencies
  // over raw items by the group it belongs to, if any.
  for (auto& edgeList : this->EntryConstraintGraph) {
    for (auto& edge : edgeList) {
      size_t index = edge;
      if (this->EntryList[index].Kind == LinkEntry::Group ||
          this->EntryList[index].Kind == LinkEntry::Flag ||
          this->EntryList[index].Kind == LinkEntry::Object) {
        continue;
      }
      // search the item in the defined groups
      for (const auto& groupItems : this->GroupItems) {
        auto pos = std::find(groupItems.second.cbegin(),
                             groupItems.second.cend(), index);
        if (pos != groupItems.second.cend()) {
          // replace lib dependency by the group it belongs to
          edge = cmGraphEdge{ groupItems.first, false, false,
                              cmListFileBacktrace() };
        }
      }
    }
  }
}